

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::FlushEdits(Hunk *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->hunk_removes_).
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->hunk_removes_) {
    std::__detail::_List_node_base::_M_transfer((_List_node_base *)&this->hunk_,p_Var2);
    psVar1 = &(this->hunk_).
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + (this->hunk_removes_).
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node._M_size;
    (this->hunk_removes_).
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  p_Var2 = (this->hunk_adds_).
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->hunk_adds_) {
    std::__detail::_List_node_base::_M_transfer((_List_node_base *)&this->hunk_,p_Var2);
    psVar1 = &(this->hunk_).
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + (this->hunk_adds_).
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node._M_size;
    (this->hunk_adds_).
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

void FlushEdits() {
    hunk_.splice(hunk_.end(), hunk_removes_);
    hunk_.splice(hunk_.end(), hunk_adds_);
  }